

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example0.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ostream *poVar19;
  char *pcVar20;
  char *pcVar21;
  Scalar d2;
  Scalar d1;
  Scalar d0;
  Point3 p2;
  Point3 p1;
  Point3 p6;
  Point3 p5;
  Point3 p4;
  Point3 p3;
  S_Sphere sphere;
  CD_Pair pair2;
  S_Superellipsoid super;
  S_Box box;
  CD_Pair pair3;
  CD_Pair pair1;
  string local_f98;
  Vector3 local_f78;
  double local_f60;
  double local_f58;
  double local_f50;
  Vector3 local_f48;
  Vector3 local_f28;
  Vector3 local_f08;
  Vector3 local_ee8;
  Vector3 local_ec8;
  Vector3 local_ea8;
  S_Sphere local_e90 [152];
  string local_df8 [32];
  double local_9e8 [27];
  undefined8 local_910;
  undefined8 local_908;
  undefined8 local_900;
  S_Box local_8f8 [168];
  Vector3 local_850 [43];
  double local_440 [130];
  
  *(undefined8 *)(sch::S_Box::~S_Box + *(long *)(std::cout + -0x18)) = 0xf;
  *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 0xf;
  sch::S_Box::S_Box(local_8f8,0.2,0.1,0.4);
  local_440[0] = 0.1;
  local_df8[0]._M_dataplus._M_p = (pointer)0x3fe6666666666666;
  local_850[0].m_x = 0.9;
  sch::S_Object::setPosition((double *)local_8f8,local_440,(double *)local_df8);
  local_440[0] = 0.1;
  local_df8[0]._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  local_850[0].m_x = 0.7;
  sch::S_Object::setOrientation((double *)local_8f8,local_440,(double *)local_df8);
  local_440[0] = 0.3;
  sch::S_Sphere::S_Sphere(local_e90,local_440);
  local_440[0] = 0.5;
  local_df8[0]._M_dataplus._M_p = (pointer)0x3fe999999999999a;
  local_850[0].m_x = 1.1;
  sch::S_Object::addScale((double *)local_e90,local_440,(double *)local_df8);
  local_440[0] = 0.1;
  local_df8[0]._M_dataplus._M_p = (pointer)0xbfe6666666666666;
  local_850[0].m_x = -0.9;
  sch::S_Object::setPosition((double *)local_e90,local_440,(double *)local_df8);
  local_910 = 0x3fd314c3d92a9e91;
  local_908 = 0x3fe314c3d92a9e91;
  local_900 = 0x3fe7d9f4cf754635;
  local_440[0] = 0.8;
  sch::S_Object::addRotation((double *)local_e90,(Vector3T *)local_440);
  sch::CD_Pair::CD_Pair((CD_Pair *)local_440,(S_Object *)local_8f8,(S_Object *)local_e90);
  bVar2 = sch::CD_Pair::isInCollision();
  local_f50 = (double)sch::CD_Pair::getDistance();
  local_f50 = ABS(local_f50);
  if (local_f50 < 0.0) {
    local_f50 = sqrt(local_f50);
  }
  else {
    local_f50 = SQRT(local_f50);
  }
  local_f28.m_z = 0.0;
  local_f28.m_x = 0.0;
  local_f28.m_y = 0.0;
  local_f48.m_z = 0.0;
  local_f48.m_x = 0.0;
  local_f48.m_y = 0.0;
  sch::CD_Pair::getClosestPoints((Vector3T *)local_440,(Vector3T *)&local_f28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"First Query",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Collision: ",0xb);
  pcVar20 = "False";
  pcVar21 = "False";
  if (bVar2 != 0) {
    pcVar21 = "True";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar21,(ulong)bVar2 ^ 5)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Distance: ",10);
  poVar19 = std::ostream::_M_insert<double>(local_f50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Witness points: ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P1: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f28.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f28.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f28.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P2: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f48.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f48.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f48.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  local_850[0].m_x = 1.75797057738;
  paVar1 = &local_df8[0].field_2;
  local_df8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df8,"First query, d0. ","");
  bVar3 = compare<double>(&local_f50,&local_850[0].m_x,local_df8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_df8[0]._M_dataplus._M_p,local_df8[0].field_2._M_allocated_capacity + 1);
  }
  local_850[0].m_x = 0.0292236259886;
  local_850[0].m_y = 0.601445137096;
  local_850[0].m_z = 0.705635281289;
  local_df8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df8,"First query, p1. ","");
  bVar4 = compare(&local_f28,local_850,local_df8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_df8[0]._M_dataplus._M_p,local_df8[0].field_2._M_allocated_capacity + 1);
  }
  local_850[0].m_x = 0.0239874216807;
  local_850[0].m_y = -0.336387177086;
  local_850[0].m_z = -0.781275504057;
  local_df8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df8,"First query, p2. ","");
  bVar5 = compare(&local_f48,local_850,local_df8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_df8[0]._M_dataplus._M_p,local_df8[0].field_2._M_allocated_capacity + 1);
  }
  local_df8[0]._M_dataplus._M_p = (pointer)0x0;
  local_850[0].m_x = 0.0;
  local_9e8[0] = 0.0;
  sch::S_Object::setPosition((double *)local_8f8,(double *)local_df8,&local_850[0].m_x);
  local_df8[0]._M_dataplus._M_p = (pointer)0x3f847ae147ae147b;
  local_850[0].m_x = 0.0;
  local_9e8[0] = 0.0;
  sch::S_Object::setPosition((double *)local_e90,(double *)local_df8,&local_850[0].m_x);
  bVar2 = sch::CD_Pair::isInCollision();
  local_f58 = (double)sch::CD_Pair::getDistanceWithoutPenetrationDepth();
  local_f58 = ABS(local_f58);
  if (local_f58 < 0.0) {
    local_f58 = sqrt(local_f58);
  }
  else {
    local_f58 = SQRT(local_f58);
  }
  local_f60 = (double)sch::CD_Pair::getDistance();
  local_f60 = ABS(local_f60);
  if (local_f60 < 0.0) {
    local_f60 = sqrt(local_f60);
  }
  else {
    local_f60 = SQRT(local_f60);
  }
  sch::CD_Pair::getClosestPoints((Vector3T *)local_440,(Vector3T *)&local_f28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Second Query",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Collision: ",0xb);
  if (bVar2 != 0) {
    pcVar20 = "True";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar20,(ulong)bVar2 ^ 5)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Distance: ",10);
  poVar19 = std::ostream::_M_insert<double>(local_f58);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Depth: ",7);
  poVar19 = std::ostream::_M_insert<double>(local_f60);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Witness points: ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P1: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f28.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f28.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f28.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P2: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f48.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f48.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f48.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  local_850[0].m_x = 0.0;
  local_df8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df8,"Second query, d1. ","");
  bVar6 = compare<double>(&local_f58,&local_850[0].m_x,local_df8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_df8[0]._M_dataplus._M_p,local_df8[0].field_2._M_allocated_capacity + 1);
  }
  local_850[0].m_x = 0.293744618861213;
  local_df8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df8,"Second query, d2. ","");
  bVar7 = compare<double>(&local_f60,&local_850[0].m_x,local_df8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_df8[0]._M_dataplus._M_p,local_df8[0].field_2._M_allocated_capacity + 1);
  }
  local_850[0].m_x = 0.0110146674327551;
  local_850[0].m_y = -0.0498945075944604;
  local_850[0].m_z = -0.0551780527427314;
  local_df8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df8,"Second query, p1. ","");
  bVar8 = compare(&local_f28,local_850,local_df8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_df8[0]._M_dataplus._M_p,local_df8[0].field_2._M_allocated_capacity + 1);
  }
  local_850[0].m_x = -0.158401731667896;
  local_850[0].m_y = 0.18954845401356;
  local_850[0].m_z = -0.0393334018450828;
  local_df8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_df8,"Second query, p2. ","");
  bVar9 = compare(&local_f48,local_850,local_df8,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_df8[0]._M_dataplus._M_p,local_df8[0].field_2._M_allocated_capacity + 1);
  }
  sch::S_Superellipsoid::S_Superellipsoid((S_Superellipsoid *)local_9e8,0.1,0.9,0.3,0.5,0.8);
  local_df8[0]._M_dataplus._M_p = (pointer)0x3fc999999999999a;
  local_850[0].m_x = 0.8;
  local_f98._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  sch::S_Object::setPosition(local_9e8,(double *)local_df8,&local_850[0].m_x);
  local_df8[0]._M_dataplus._M_p = (pointer)0x3fc999999999999a;
  local_850[0].m_x = 1.7;
  local_f98._M_dataplus._M_p = (pointer)0x3fe999999999999a;
  sch::S_Object::setOrientation(local_9e8,(double *)local_df8,&local_850[0].m_x);
  sch::CD_Pair::CD_Pair((CD_Pair *)local_df8,(S_Object *)local_8f8,(S_Object *)local_9e8);
  sch::CD_Pair::CD_Pair((CD_Pair *)local_850,(S_Object *)local_e90,(S_Object *)local_9e8);
  local_ea8.m_x = 0.0;
  local_ea8.m_y = 0.0;
  local_ea8.m_z = 0.0;
  local_ec8.m_z = 0.0;
  local_ec8.m_x = 0.0;
  local_ec8.m_y = 0.0;
  local_ee8.m_z = 0.0;
  local_ee8.m_x = 0.0;
  local_ee8.m_y = 0.0;
  local_f08.m_z = 0.0;
  local_f08.m_x = 0.0;
  local_f08.m_y = 0.0;
  local_f50 = (double)sch::CD_Pair::getClosestPoints((Vector3T *)local_440,(Vector3T *)&local_f28);
  local_f58 = (double)sch::CD_Pair::getClosestPoints((Vector3T *)local_df8,(Vector3T *)&local_ea8);
  local_f60 = (double)sch::CD_Pair::getClosestPoints((Vector3T *)local_850,(Vector3T *)&local_ee8);
  local_f78.m_x = -0.0862859011099191;
  paVar1 = &local_f98.field_2;
  local_f98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"Third Query, d0","");
  bVar10 = compare<double>(&local_f50,&local_f78.m_x,&local_f98,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != paVar1) {
    operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
  }
  local_f78.m_x = 0.0110146674327551;
  local_f78.m_y = -0.0498945075944604;
  local_f78.m_z = -0.0551780527427314;
  local_f98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"Third Query, p1","");
  bVar11 = compare(&local_f28,&local_f78,&local_f98,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != paVar1) {
    operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
  }
  local_f78.m_x = -0.158401731667896;
  local_f78.m_y = 0.18954845401356;
  local_f78.m_z = -0.0393334018450828;
  local_f98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"Third Query, p2","");
  bVar12 = compare(&local_f48,&local_f78,&local_f98,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != paVar1) {
    operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
  }
  local_f78.m_x = 0.659596933491;
  local_f98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"Third Query, d1","");
  bVar13 = compare<double>(&local_f58,&local_f78.m_x,&local_f98,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != paVar1) {
    operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
  }
  local_f78.m_x = 0.0707763740114;
  local_f78.m_y = 0.0985548629043;
  local_f78.m_z = 0.194364718711;
  local_f98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"Third Query, p3","");
  bVar14 = compare(&local_ea8,&local_f78,&local_f98,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != paVar1) {
    operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
  }
  local_f78.m_x = 0.259412979986;
  local_f78.m_y = 0.301096580075;
  local_f78.m_z = 0.95790254828;
  local_f98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"Third Query, p4","");
  bVar15 = compare(&local_ec8,&local_f78,&local_f98,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != paVar1) {
    operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
  }
  local_f78.m_x = 0.516365498703901;
  local_f98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"Third Query, d2","");
  bVar16 = compare<double>(&local_f60,&local_f78.m_x,&local_f98,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != paVar1) {
    operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
  }
  local_f78.m_x = 0.126586144900461;
  local_f78.m_y = 0.0390218116062935;
  local_f78.m_z = 0.297048794226006;
  local_f98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"Third Query, p5","");
  bVar17 = compare(&local_ee8,&local_f78,&local_f98,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != paVar1) {
    operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
  }
  local_f78.m_x = 0.300323477842992;
  local_f78.m_y = 0.23919818987692;
  local_f78.m_z = 0.964963650647371;
  local_f98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"Third Query, p6","");
  bVar18 = compare(&local_f08,&local_f78,&local_f98,1e-12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != paVar1) {
    operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Third Query",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Distance1 Squared: ",0x13);
  poVar19 = std::ostream::_M_insert<double>(local_f50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Witness points 1: ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P1: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f28.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f28.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f28.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P2: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f48.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f48.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f48.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Distance2 Squared: ",0x13);
  poVar19 = std::ostream::_M_insert<double>(local_f58);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Witness points 2: ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P1: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_ea8.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_ea8.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_ea8.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P2: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_ec8.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_ec8.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_ec8.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Distance3 Squared: ",0x13);
  poVar19 = std::ostream::_M_insert<double>(local_f60);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Witness points 3: ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P1: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_ee8.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_ee8.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_ee8.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P2: ",4);
  poVar19 = std::ostream::_M_insert<double>(local_f08.m_x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f08.m_y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  poVar19 = std::ostream::_M_insert<double>(local_f08.m_z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  sch::CD_Pair::~CD_Pair((CD_Pair *)local_850);
  sch::CD_Pair::~CD_Pair((CD_Pair *)local_df8);
  sch::S_Superellipsoid::~S_Superellipsoid((S_Superellipsoid *)local_9e8);
  sch::CD_Pair::~CD_Pair((CD_Pair *)local_440);
  sch::S_Sphere::~S_Sphere(local_e90);
  sch::S_Box::~S_Box(local_8f8);
  return (uint)((((!bVar16 || !bVar17) || !bVar18) || ((!bVar14 || !bVar15) || (!bVar12 || !bVar13))
                ) || ((!bVar10 || !bVar11) ||
                     (((!bVar7 || !bVar8) || !bVar9) || ((!bVar5 || !bVar6) || (!bVar3 || !bVar4))))
               );
}

Assistant:

int main(int /*argc*/, char * /*argv*/[])
{
#ifdef ENABLE_SIGFPE
  feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT);
#endif

  // Set output precision
  std::cout.precision(std::numeric_limits<double>::digits10);
  std::cerr.precision(std::numeric_limits<double>::digits10);

  //***********
  // Object initializations

  // A box with height, width and depth
  S_Box box(0.2, 0.1, 0.4);

  // Set the position in the world reference frame
  box.setPosition(0.1, 0.7, 0.9);

  // Set the orientation of the Object
  //(many different orientations representations are supported, here Roll
  //  pitch yaw)
  box.setOrientation(0.1, 1, 0.7);

  // A second object, a sphere with a radius
  S_Sphere sphere(0.3);

  // let's transform it into an ellipsoid
  // we add an anisotropic scale to the sphere
  //  (the scale has to be the first operation as it affects also
  //  rotations and translations)
  sphere.addScale(0.5, 0.8, 1.1);

  // Set the position in the world reference frame
  sphere.setPosition(0.1, -0.7, -0.9);

  // We turn it around the axis vrot defined by
  Vector3 vrot(0.2, 0.4, 0.5);
  vrot = vrot / vrot.norm();

  // let's turn it by 0.8 rad (we use addRotation instead of setRotation
  //  to not loose the scale)
  sphere.addRotation(0.8, vrot);

  //********
  // Proximity queries

  // Create a proximity-query pair of objects. It takes the addresses of the
  // objects. The user is responsible of guaranteeing the existance of the
  // objects at these addresses during all the period of use of the pair and
  // desrtoying the objects at the end.
  // Note that STL containers (vectors, deque, etc.) do not guarantee that
  // objects remain at same address. Use them with care.
  CD_Pair pair1(&box, &sphere);

  // Are they in collision ?
  // This is the fastest proximity query as it runs GJK with the lowest
  //  precision
  Scalar collision = pair1.isInCollision();

  // This runs GJK with 1e-6 precision.
  //  WARNING : THE PROVIDED DISTANCE IS SQUARED for computation time
  //  purpose, the real distance is then obtained by square root
  //  this algorithm takes profit from the warm start provided by the
  //  previous query, so there is virtually no additional cost at making
  //  these two requests instead of directly the last one.
  //  if there is a collision, this will compute the penetration depth
  Scalar d0 = sqrt(fabs(pair1.getDistance()));

  // Our witness points
  Point3 p1, p2;
  // get the Witness points without running GJK or depth computation again
  //  (it detects that the object did not move since the last query, if
  //  one or both moved, this query would trigger GJK algorithm).
  //  this method returns the distance also.
  pair1.getClosestPoints(p1, p2);

  // Let's display all this stuff
  std::cout << "First Query" << std::endl;
  std::cout << "Collision: " << (collision ? "True" : "False") << std::endl;
  std::cout << "Distance: " << d0 << std::endl;
  std::cout << "Witness points: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << std::endl;

  // compare the results for first query
  bool comparison = true;
  comparison = compare(d0, 1.75797057738, "First query, d0. ") && comparison;
  comparison =
      compare(p1, (Vector3(0.0292236259886, 0.601445137096, 0.705635281289)), "First query, p1. ") && comparison;
  comparison =
      compare(p2, (Vector3(0.0239874216807, -0.336387177086, -0.781275504057)), "First query, p2. ") && comparison;

  // Now we move the objects to enter in collision
  // We avoid symmetries to always get the same witness points.
  box.setPosition(0, 0, 0);
  sphere.setPosition(0.01, 0, 0);

  // Query again
  collision = pair1.isInCollision();

  // Let's run again the Distance computation, but not the penetration
  // depth, because the last algorithm is much slower, if there is a
  // collision, the output would be zero
  //
  Scalar d1 = sqrt(fabs(pair1.getDistanceWithoutPenetrationDepth()));

  // We call now the regular distance query (collision will trigger
  // depth query and the distance will be given in negative to distinguish
  //  it from separating distance)
  Scalar d2 = sqrt(fabs(pair1.getDistance()));

  // Our witness points
  pair1.getClosestPoints(p1, p2);

  // Let's display all this stuff
  std::cout << "Second Query" << std::endl;
  std::cout << "Collision: " << (collision ? "True" : "False") << std::endl;
  std::cout << "Distance: " << d1 << std::endl;
  std::cout << "Depth: " << d2 << std::endl;
  std::cout << "Witness points: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << std::endl;

  // compare the results for second query
  comparison = compare(d1, 0., "Second query, d1. ") && comparison;
#ifdef SCH_BUILD_BSD
  comparison = compare(d2, 0., "Second query, d2. ") && comparison;
  comparison =
      compare(p1, (Vector3(-0.211100297803413, -0.0866553324786505, -0.0206764992279858)), "Second query, p1. ")
      && comparison;
  comparison = compare(p2, (Vector3(0.201035958824805, -0.171232378087511, 0.066080909954798)), "Second query, p2. ")
               && comparison;
#else
  comparison = compare(d2, 0.293744618861213, "Second query, d2. ") && comparison;
  comparison =
      compare(p1, (Vector3(0.0110146674327551, -0.0498945075944604, -0.0551780527427314)), "Second query, p1. ")
      && comparison;
  comparison = compare(p2, (Vector3(-0.158401731667896, 0.18954845401356, -0.0393334018450828)), "Second query, p2. ")
               && comparison;
#endif

  //******************
  // More objects

  // Create the third object
  //  A superellipsoid with height, width, depth, epsilon1, epsilon2
  S_Superellipsoid super(0.1, 0.9, 0.3, 0.5, 0.8);

  // Position/Orientation
  super.setPosition(0.2, 0.8, 1);
  super.setOrientation(0.2, 1.7, 0.8);

  // Creation of new pairs related to the new objects. Each pair of 3D objects
  // is then a C++ objects
  CD_Pair pair2(&box, &super);
  CD_Pair pair3(&sphere, &super);

  // Our witness points
  Point3 p3, p4, p5, p6;

  // We can directly ask for the closest points
  // When the returned value is negative, it is the opposite of the squared
  // depth.
  d0 = pair1.getClosestPoints(p1, p2);
  d1 = pair2.getClosestPoints(p3, p4);
  d2 = pair3.getClosestPoints(p5, p6);

  // compare the results for third query
#ifdef SCH_BUILD_BSD
  comparison = compare(d0, 0., "Third Query, d0") && comparison;
  comparison = compare(p1, (Vector3(-0.211100297803413, -0.0866553324786505, -0.0206764992279858)), "Third Query, p1")
               && comparison;
  comparison =
      compare(p2, (Vector3(0.201035958824805, -0.171232378087511, 0.066080909954798)), "Third Query, p2") && comparison;
#else
  comparison = compare(d0, -0.0862859011099191, "Third Query, d0") && comparison;
  comparison = compare(p1, (Vector3(0.0110146674327551, -0.0498945075944604, -0.0551780527427314)), "Third Query, p1")
               && comparison;
  comparison = compare(p2, (Vector3(-0.158401731667896, 0.18954845401356, -0.0393334018450828)), "Third Query, p2")
               && comparison;
#endif

  comparison = compare(d1, 0.659596933491, "Third Query, d1") && comparison;
  comparison =
      compare(p3, (Vector3(0.0707763740114, 0.0985548629043, 0.194364718711)), "Third Query, p3") && comparison;
  comparison = compare(p4, (Vector3(0.259412979986, 0.301096580075, 0.95790254828)), "Third Query, p4") && comparison;

  comparison = compare(d2, 0.516365498703901, "Third Query, d2") && comparison;
  comparison = compare(p5, (sch::Vector3(0.126586144900461, 0.0390218116062935, 0.297048794226006)), "Third Query, p5")
               && comparison;
  comparison = compare(p6, (sch::Vector3(0.300323477842992, 0.23919818987692, 0.964963650647371)), "Third Query, p6")
               && comparison;

  // Let's display all this stuff
  std::cout << "Third Query" << std::endl;
  std::cout << "Distance1 Squared: " << d0 << std::endl;
  std::cout << "Witness points 1: " << std::endl;
  std::cout << "P1: " << p1 << std::endl;
  std::cout << "P2: " << p2 << std::endl;
  std::cout << "Distance2 Squared: " << d1 << std::endl;
  std::cout << "Witness points 2: " << std::endl;
  std::cout << "P1: " << p3 << std::endl;
  std::cout << "P2: " << p4 << std::endl;
  std::cout << "Distance3 Squared: " << d2 << std::endl;
  std::cout << "Witness points 3: " << std::endl;
  std::cout << "P1: " << p5 << std::endl;
  std::cout << "P2: " << p6 << std::endl;
  std::cout << std::endl;

  return (comparison ? 0 : 1);
  // That's all folks
}